

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O2

v4sf * rfftf1_ps(int n,v4sf *input_readonly,v4sf *work1,v4sf *work2,float *wa,int *ifac)

{
  float *pfVar1;
  float *pfVar2;
  v4sf *pafVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  v4sf *pafVar9;
  v4sf *pafVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  v4sf *pafVar14;
  v4sf *pafVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  v4sf *pafVar21;
  long lVar22;
  v4sf *pafVar23;
  int iVar24;
  long lVar25;
  uint l1;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  v4sf *pafVar30;
  v4sf *pafVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  bool bVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  v4sf *local_120;
  
  local_120 = work2;
  if (input_readonly == work2) {
    local_120 = work1;
  }
  if ((work1 != work2) && (local_120 != input_readonly)) {
    iVar4 = ifac[1];
    iVar11 = 0;
    if (0 < iVar4) {
      iVar11 = iVar4;
    }
    uVar19 = 1;
    uVar5 = (ulong)(uint)n;
    iVar34 = n + -1;
    while( true ) {
      iVar7 = (int)uVar5;
      if (uVar19 == iVar11 + 1) {
        return input_readonly;
      }
      iVar12 = ifac[((long)iVar4 - uVar19) + 2];
      uVar5 = (long)iVar7 / (long)iVar12;
      iVar7 = n / iVar7;
      if (3 < iVar12 - 2U) break;
      iVar24 = (iVar12 + -1) * iVar7;
      iVar17 = iVar34 - iVar24;
      lVar16 = (long)iVar7;
      l1 = (uint)uVar5;
      lVar33 = (long)(int)l1;
      switch(iVar12) {
      case 2:
        radf2_ps(iVar7,l1,input_readonly,local_120,wa + iVar17);
        break;
      case 3:
        uVar36 = 0;
        if (0 < (int)l1) {
          uVar36 = uVar5 & 0xffffffff;
        }
        pafVar15 = input_readonly;
        uVar28 = uVar36;
        pafVar30 = local_120;
        while (bVar37 = uVar28 != 0, uVar28 = uVar28 - 1, bVar37) {
          pafVar14 = pafVar15 + lVar33 * lVar16;
          fVar65 = (*pafVar14)[0];
          fVar68 = (*pafVar14)[1];
          fVar71 = (*pafVar14)[2];
          fVar67 = (*pafVar14)[3];
          pfVar1 = (float *)((long)*pafVar15 + lVar16 * 0x10 * (long)(int)(l1 * 2));
          fVar38 = *pfVar1;
          fVar39 = pfVar1[1];
          fVar40 = pfVar1[2];
          fVar41 = pfVar1[3];
          fVar46 = fVar65 + fVar38;
          fVar47 = fVar68 + fVar39;
          fVar48 = fVar71 + fVar40;
          fVar49 = fVar67 + fVar41;
          fVar42 = (*pafVar15)[0];
          fVar43 = (*pafVar15)[1];
          fVar44 = (*pafVar15)[2];
          fVar45 = (*pafVar15)[3];
          (*pafVar30)[0] = fVar42 + fVar46;
          (*pafVar30)[1] = fVar43 + fVar47;
          (*pafVar30)[2] = fVar44 + fVar48;
          (*pafVar30)[3] = fVar45 + fVar49;
          pafVar14 = pafVar30 + lVar16 * 2;
          (*pafVar14)[0] = (fVar38 - fVar65) * 0.8660254;
          (*pafVar14)[1] = (fVar39 - fVar68) * 0.8660254;
          (*pafVar14)[2] = (fVar40 - fVar71) * 0.8660254;
          (*pafVar14)[3] = (fVar41 - fVar67) * 0.8660254;
          pafVar14 = pafVar30 + lVar16 * 2 + -1;
          (*pafVar14)[0] = fVar46 * -0.5 + fVar42;
          (*pafVar14)[1] = fVar47 * -0.5 + fVar43;
          (*pafVar14)[2] = fVar48 * -0.5 + fVar44;
          (*pafVar14)[3] = fVar49 * -0.5 + fVar45;
          pafVar30 = pafVar30 + lVar16 * 3;
          pafVar15 = pafVar15 + lVar16;
        }
        if (iVar7 != 1) {
          for (uVar28 = 0; uVar28 != uVar36; uVar28 = uVar28 + 1) {
            lVar8 = (uVar28 + lVar33) * lVar16;
            lVar22 = (uVar28 + (long)(int)(l1 * 2)) * lVar16;
            lVar27 = uVar28 * 3 * lVar16;
            lVar29 = (uVar28 * 3 + 2) * lVar16;
            lVar25 = (uVar28 * 3 + 1) * lVar16;
            for (lVar20 = 2; lVar26 = lVar16 - lVar20, lVar26 != 0 && lVar20 <= lVar16;
                lVar20 = lVar20 + 2) {
              fVar65 = wa[(long)iVar17 + lVar20 + -2];
              fVar68 = wa[(long)iVar17 + lVar20 + -1];
              lVar35 = lVar20 + -1;
              pafVar15 = input_readonly + lVar8 + lVar35;
              pafVar30 = input_readonly + lVar8 + lVar20;
              fVar50 = fVar68 * (*pafVar30)[0] + (*pafVar15)[0] * fVar65;
              fVar52 = fVar68 * (*pafVar30)[1] + (*pafVar15)[1] * fVar65;
              fVar54 = fVar68 * (*pafVar30)[2] + (*pafVar15)[2] * fVar65;
              fVar56 = fVar68 * (*pafVar30)[3] + (*pafVar15)[3] * fVar65;
              fVar42 = fVar65 * (*pafVar30)[0] - (*pafVar15)[0] * fVar68;
              fVar43 = fVar65 * (*pafVar30)[1] - (*pafVar15)[1] * fVar68;
              fVar44 = fVar65 * (*pafVar30)[2] - (*pafVar15)[2] * fVar68;
              fVar45 = fVar65 * (*pafVar30)[3] - (*pafVar15)[3] * fVar68;
              fVar65 = wa[(long)(iVar17 + iVar7) + lVar20 + -2];
              fVar68 = wa[(long)(iVar17 + iVar7) + lVar20 + -1];
              pafVar15 = input_readonly + lVar22 + lVar35;
              pafVar30 = input_readonly + lVar22 + lVar20;
              fVar46 = fVar68 * (*pafVar30)[0] + (*pafVar15)[0] * fVar65;
              fVar47 = fVar68 * (*pafVar30)[1] + (*pafVar15)[1] * fVar65;
              fVar48 = fVar68 * (*pafVar30)[2] + (*pafVar15)[2] * fVar65;
              fVar49 = fVar68 * (*pafVar30)[3] + (*pafVar15)[3] * fVar65;
              fVar51 = fVar65 * (*pafVar30)[0] - (*pafVar15)[0] * fVar68;
              fVar53 = fVar65 * (*pafVar30)[1] - (*pafVar15)[1] * fVar68;
              fVar55 = fVar65 * (*pafVar30)[2] - (*pafVar15)[2] * fVar68;
              fVar57 = fVar65 * (*pafVar30)[3] - (*pafVar15)[3] * fVar68;
              fVar58 = fVar50 + fVar46;
              fVar59 = fVar52 + fVar47;
              fVar60 = fVar54 + fVar48;
              fVar61 = fVar56 + fVar49;
              fVar62 = fVar42 + fVar51;
              fVar63 = fVar43 + fVar53;
              fVar64 = fVar44 + fVar55;
              fVar66 = fVar45 + fVar57;
              pafVar15 = input_readonly + uVar28 * lVar16 + lVar35;
              fVar65 = (*pafVar15)[0];
              fVar68 = (*pafVar15)[1];
              fVar71 = (*pafVar15)[2];
              fVar67 = (*pafVar15)[3];
              pafVar15 = local_120 + lVar27 + lVar35;
              (*pafVar15)[0] = fVar65 + fVar58;
              (*pafVar15)[1] = fVar68 + fVar59;
              (*pafVar15)[2] = fVar71 + fVar60;
              (*pafVar15)[3] = fVar67 + fVar61;
              pafVar15 = input_readonly + uVar28 * lVar16 + lVar20;
              fVar38 = (*pafVar15)[0];
              fVar39 = (*pafVar15)[1];
              fVar40 = (*pafVar15)[2];
              fVar41 = (*pafVar15)[3];
              pafVar15 = local_120 + lVar27 + lVar20;
              (*pafVar15)[0] = fVar38 + fVar62;
              (*pafVar15)[1] = fVar39 + fVar63;
              (*pafVar15)[2] = fVar40 + fVar64;
              (*pafVar15)[3] = fVar41 + fVar66;
              fVar65 = fVar65 - fVar58 * 0.5;
              fVar68 = fVar68 - fVar59 * 0.5;
              fVar71 = fVar71 - fVar60 * 0.5;
              fVar67 = fVar67 - fVar61 * 0.5;
              fVar38 = fVar38 - fVar62 * 0.5;
              fVar39 = fVar39 - fVar63 * 0.5;
              fVar40 = fVar40 - fVar64 * 0.5;
              fVar41 = fVar41 - fVar66 * 0.5;
              fVar42 = (fVar42 - fVar51) * 0.8660254;
              fVar43 = (fVar43 - fVar53) * 0.8660254;
              fVar44 = (fVar44 - fVar55) * 0.8660254;
              fVar45 = (fVar45 - fVar57) * 0.8660254;
              fVar46 = (fVar46 - fVar50) * 0.8660254;
              fVar47 = (fVar47 - fVar52) * 0.8660254;
              fVar48 = (fVar48 - fVar54) * 0.8660254;
              fVar49 = (fVar49 - fVar56) * 0.8660254;
              pafVar15 = local_120 + lVar29 + lVar35;
              (*pafVar15)[0] = fVar42 + fVar65;
              (*pafVar15)[1] = fVar43 + fVar68;
              (*pafVar15)[2] = fVar44 + fVar71;
              (*pafVar15)[3] = fVar45 + fVar67;
              pfVar1 = (float *)((long)*local_120 +
                                ((long)(((ulong)(uint)((int)lVar25 + (int)lVar26) << 0x20) +
                                       -0x100000000) >> 0x1c));
              *pfVar1 = fVar65 - fVar42;
              pfVar1[1] = fVar68 - fVar43;
              pfVar1[2] = fVar71 - fVar44;
              pfVar1[3] = fVar67 - fVar45;
              pafVar15 = local_120 + lVar29 + lVar20;
              (*pafVar15)[0] = fVar46 + fVar38;
              (*pafVar15)[1] = fVar47 + fVar39;
              (*pafVar15)[2] = fVar48 + fVar40;
              (*pafVar15)[3] = fVar49 + fVar41;
              pafVar15 = local_120 + lVar25 + lVar26;
              (*pafVar15)[0] = fVar46 - fVar38;
              (*pafVar15)[1] = fVar47 - fVar39;
              (*pafVar15)[2] = fVar48 - fVar40;
              (*pafVar15)[3] = fVar49 - fVar41;
            }
          }
        }
        break;
      case 4:
        radf4_ps(iVar7,l1,input_readonly,local_120,wa + iVar17,wa + (iVar17 + iVar7),
                 wa + (iVar7 + iVar17 + iVar7));
        break;
      case 5:
        iVar12 = iVar17 + iVar7 + iVar7;
        uVar13 = ~(iVar7 * 6);
        lVar20 = (long)(int)(~l1 * iVar7 + -1);
        uVar36 = 0;
        if (0 < (int)l1) {
          uVar36 = uVar5 & 0xffffffff;
        }
        iVar6 = (int)uVar36;
        iVar32 = iVar7 * 10;
        lVar8 = (long)(int)(iVar7 * 6 ^ 0xfffffffe);
        lVar22 = (lVar33 + 1) * lVar16;
        lVar25 = ((long)(int)(l1 * 3) + 1) * lVar16;
        lVar29 = ((long)(int)(l1 * 4) + 1) * lVar16;
        lVar27 = ((long)(int)(l1 * 2) + 1) * lVar16;
        lVar33 = ((long)(int)(l1 * 5) + 1) * lVar16;
        iVar18 = iVar7 * 8;
        pafVar9 = local_120 + lVar8 + lVar16 * 6 + 2;
        pafVar21 = input_readonly + lVar22 + 1;
        pafVar15 = input_readonly + lVar25 + 1;
        pafVar30 = input_readonly + lVar29 + 1;
        pafVar14 = input_readonly + lVar27 + 1;
        pafVar10 = input_readonly + lVar33 + 1;
        while (bVar37 = uVar36 != 0, uVar36 = uVar36 - 1, bVar37) {
          pafVar31 = pafVar10 + lVar20;
          pafVar23 = pafVar14 + lVar20;
          fVar46 = (*pafVar31)[0] + (*pafVar23)[0];
          fVar47 = (*pafVar31)[1] + (*pafVar23)[1];
          fVar48 = (*pafVar31)[2] + (*pafVar23)[2];
          fVar49 = (*pafVar31)[3] + (*pafVar23)[3];
          fVar38 = (*pafVar31)[0] - (*pafVar23)[0];
          fVar39 = (*pafVar31)[1] - (*pafVar23)[1];
          fVar40 = (*pafVar31)[2] - (*pafVar23)[2];
          fVar41 = (*pafVar31)[3] - (*pafVar23)[3];
          pafVar31 = pafVar30 + lVar20;
          pafVar23 = pafVar15 + lVar20;
          fVar50 = (*pafVar31)[0] + (*pafVar23)[0];
          fVar52 = (*pafVar31)[1] + (*pafVar23)[1];
          fVar54 = (*pafVar31)[2] + (*pafVar23)[2];
          fVar56 = (*pafVar31)[3] + (*pafVar23)[3];
          fVar42 = (*pafVar31)[0] - (*pafVar23)[0];
          fVar43 = (*pafVar31)[1] - (*pafVar23)[1];
          fVar44 = (*pafVar31)[2] - (*pafVar23)[2];
          fVar45 = (*pafVar31)[3] - (*pafVar23)[3];
          pafVar31 = pafVar21 + lVar20;
          fVar65 = (*pafVar31)[0];
          fVar68 = (*pafVar31)[1];
          fVar71 = (*pafVar31)[2];
          fVar67 = (*pafVar31)[3];
          (*pafVar9)[0] = fVar46 + fVar50 + fVar65;
          (*pafVar9)[1] = fVar47 + fVar52 + fVar68;
          (*pafVar9)[2] = fVar48 + fVar54 + fVar71;
          (*pafVar9)[3] = fVar49 + fVar56 + fVar67;
          pafVar31 = local_120 + (long)(int)uVar13 + (long)iVar18;
          (*pafVar31)[0] = (fVar46 * 0.309017 - fVar50 * 0.809017) + fVar65;
          (*pafVar31)[1] = (fVar47 * 0.309017 - fVar52 * 0.809017) + fVar68;
          (*pafVar31)[2] = (fVar48 * 0.309017 - fVar54 * 0.809017) + fVar71;
          (*pafVar31)[3] = (fVar49 * 0.309017 - fVar56 * 0.809017) + fVar67;
          pafVar31 = local_120 + (long)(int)uVar13 + (long)iVar18 + 1;
          (*pafVar31)[0] = fVar42 * 0.58778524 + fVar38 * 0.95105654;
          (*pafVar31)[1] = fVar43 * 0.58778524 + fVar39 * 0.95105654;
          (*pafVar31)[2] = fVar44 * 0.58778524 + fVar40 * 0.95105654;
          (*pafVar31)[3] = fVar45 * 0.58778524 + fVar41 * 0.95105654;
          pafVar31 = local_120 + (long)(int)uVar13 + (long)iVar32;
          (*pafVar31)[0] = (fVar50 * 0.309017 - fVar46 * 0.809017) + fVar65;
          (*pafVar31)[1] = (fVar52 * 0.309017 - fVar47 * 0.809017) + fVar68;
          (*pafVar31)[2] = (fVar54 * 0.309017 - fVar48 * 0.809017) + fVar71;
          (*pafVar31)[3] = (fVar56 * 0.309017 - fVar49 * 0.809017) + fVar67;
          pafVar31 = local_120 + (long)(int)uVar13 + (long)iVar32 + 1;
          (*pafVar31)[0] = fVar38 * 0.58778524 - fVar42 * 0.95105654;
          (*pafVar31)[1] = fVar39 * 0.58778524 - fVar43 * 0.95105654;
          (*pafVar31)[2] = fVar40 * 0.58778524 - fVar44 * 0.95105654;
          (*pafVar31)[3] = fVar41 * 0.58778524 - fVar45 * 0.95105654;
          iVar32 = iVar32 + iVar7 * 5;
          iVar18 = iVar18 + iVar7 * 5;
          pafVar9 = pafVar9 + lVar16 * 5;
          pafVar21 = pafVar21 + lVar16;
          pafVar15 = pafVar15 + lVar16;
          pafVar30 = pafVar30 + lVar16;
          pafVar14 = pafVar14 + lVar16;
          pafVar10 = pafVar10 + lVar16;
        }
        if (iVar7 != 1) {
          pafVar23 = input_readonly + lVar20 + lVar22 + 3;
          pafVar15 = input_readonly + lVar20 + lVar33 + 3;
          pafVar30 = input_readonly + lVar20 + lVar29 + 3;
          pafVar14 = input_readonly + lVar20 + lVar25 + 3;
          pafVar10 = input_readonly + lVar20 + lVar27 + 3;
          pafVar9 = local_120 + lVar8 + lVar16 * 10 + 4;
          pafVar21 = local_120 + lVar8 + lVar16 * 8 + 4;
          pafVar31 = local_120 + lVar8 + lVar16 * 6 + 4;
          lVar33 = (long)(iVar12 + iVar7) * 4;
          lVar20 = (long)iVar12 * 4;
          lVar8 = (long)(iVar17 + iVar7) * 4;
          lVar22 = (long)iVar34 * 4 + (long)iVar24 * -4;
          for (uVar36 = 1; uVar36 != iVar6 + 1; uVar36 = uVar36 + 1) {
            lVar29 = (uVar36 * 5 + 2) * lVar16;
            lVar27 = (uVar36 * 5 + 4) * lVar16;
            lVar26 = 0;
            iVar34 = iVar7 + -1;
            for (lVar25 = 3; lVar25 <= lVar16; lVar25 = lVar25 + 2) {
              fVar65 = *(float *)((long)wa + lVar26 + lVar22);
              fVar68 = *(float *)((long)wa + lVar26 + lVar22 + 4);
              fVar71 = *(float *)((long)wa + lVar26 + lVar8);
              fVar67 = *(float *)((long)wa + lVar26 + lVar8 + 4);
              fVar38 = *(float *)((long)wa + lVar26 + lVar20);
              fVar39 = *(float *)((long)wa + lVar26 + lVar20 + 4);
              fVar40 = *(float *)((long)wa + lVar26 + lVar33);
              fVar41 = *(float *)((long)wa + lVar26 + lVar33 + 4);
              pfVar2 = pafVar10[-1] + lVar26;
              pfVar1 = *pafVar10 + lVar26;
              fVar58 = *pfVar1 * fVar68 + fVar65 * *pfVar2;
              fVar59 = pfVar1[1] * fVar68 + fVar65 * pfVar2[1];
              fVar60 = pfVar1[2] * fVar68 + fVar65 * pfVar2[2];
              fVar61 = pfVar1[3] * fVar68 + fVar65 * pfVar2[3];
              fVar62 = fVar68 * *pfVar2 - fVar65 * *pfVar1;
              fVar63 = fVar68 * pfVar2[1] - fVar65 * pfVar1[1];
              fVar64 = fVar68 * pfVar2[2] - fVar65 * pfVar1[2];
              fVar65 = fVar68 * pfVar2[3] - fVar65 * pfVar1[3];
              pfVar1 = pafVar14[-1] + lVar26;
              pfVar2 = *pafVar14 + lVar26;
              fVar72 = *pfVar2 * fVar67 + fVar71 * *pfVar1;
              fVar73 = pfVar2[1] * fVar67 + fVar71 * pfVar1[1];
              fVar74 = pfVar2[2] * fVar67 + fVar71 * pfVar1[2];
              fVar76 = pfVar2[3] * fVar67 + fVar71 * pfVar1[3];
              fVar68 = fVar67 * *pfVar1 - fVar71 * *pfVar2;
              fVar69 = fVar67 * pfVar1[1] - fVar71 * pfVar2[1];
              fVar70 = fVar67 * pfVar1[2] - fVar71 * pfVar2[2];
              fVar71 = fVar67 * pfVar1[3] - fVar71 * pfVar2[3];
              pfVar2 = pafVar30[-1] + lVar26;
              pfVar1 = *pafVar30 + lVar26;
              fVar51 = *pfVar1 * fVar39 + fVar38 * *pfVar2;
              fVar53 = pfVar1[1] * fVar39 + fVar38 * pfVar2[1];
              fVar55 = pfVar1[2] * fVar39 + fVar38 * pfVar2[2];
              fVar57 = pfVar1[3] * fVar39 + fVar38 * pfVar2[3];
              fVar42 = fVar39 * *pfVar2 - fVar38 * *pfVar1;
              fVar43 = fVar39 * pfVar2[1] - fVar38 * pfVar1[1];
              fVar44 = fVar39 * pfVar2[2] - fVar38 * pfVar1[2];
              fVar45 = fVar39 * pfVar2[3] - fVar38 * pfVar1[3];
              pfVar2 = pafVar15[-1] + lVar26;
              pfVar1 = *pafVar15 + lVar26;
              fVar46 = *pfVar1 * fVar41 + fVar40 * *pfVar2;
              fVar47 = pfVar1[1] * fVar41 + fVar40 * pfVar2[1];
              fVar48 = pfVar1[2] * fVar41 + fVar40 * pfVar2[2];
              fVar49 = pfVar1[3] * fVar41 + fVar40 * pfVar2[3];
              fVar50 = fVar41 * *pfVar2 - fVar40 * *pfVar1;
              fVar52 = fVar41 * pfVar2[1] - fVar40 * pfVar1[1];
              fVar54 = fVar41 * pfVar2[2] - fVar40 * pfVar1[2];
              fVar56 = fVar41 * pfVar2[3] - fVar40 * pfVar1[3];
              fVar82 = fVar58 + fVar46;
              fVar83 = fVar59 + fVar47;
              fVar84 = fVar60 + fVar48;
              fVar85 = fVar61 + fVar49;
              fVar46 = fVar46 - fVar58;
              fVar47 = fVar47 - fVar59;
              fVar48 = fVar48 - fVar60;
              fVar49 = fVar49 - fVar61;
              fVar58 = fVar62 - fVar50;
              fVar59 = fVar63 - fVar52;
              fVar60 = fVar64 - fVar54;
              fVar61 = fVar65 - fVar56;
              fVar50 = fVar50 + fVar62;
              fVar52 = fVar52 + fVar63;
              fVar54 = fVar54 + fVar64;
              fVar56 = fVar56 + fVar65;
              fVar62 = fVar72 + fVar51;
              fVar63 = fVar73 + fVar53;
              fVar64 = fVar74 + fVar55;
              fVar66 = fVar76 + fVar57;
              fVar51 = fVar51 - fVar72;
              fVar53 = fVar53 - fVar73;
              fVar55 = fVar55 - fVar74;
              fVar57 = fVar57 - fVar76;
              fVar72 = fVar68 - fVar42;
              fVar73 = fVar69 - fVar43;
              fVar74 = fVar70 - fVar44;
              fVar76 = fVar71 - fVar45;
              fVar42 = fVar42 + fVar68;
              fVar43 = fVar43 + fVar69;
              fVar44 = fVar44 + fVar70;
              fVar45 = fVar45 + fVar71;
              pfVar1 = pafVar23[-1] + lVar26;
              fVar65 = *pfVar1;
              fVar68 = pfVar1[1];
              fVar71 = pfVar1[2];
              fVar67 = pfVar1[3];
              pfVar1 = pafVar31[-1] + lVar26;
              *pfVar1 = fVar62 + fVar82 + fVar65;
              pfVar1[1] = fVar63 + fVar83 + fVar68;
              pfVar1[2] = fVar64 + fVar84 + fVar71;
              pfVar1[3] = fVar66 + fVar85 + fVar67;
              pfVar1 = *pafVar23 + lVar26;
              fVar38 = *pfVar1;
              fVar39 = pfVar1[1];
              fVar40 = pfVar1[2];
              fVar41 = pfVar1[3];
              pfVar1 = *pafVar31 + lVar26;
              *pfVar1 = fVar38 - (fVar42 + fVar50);
              pfVar1[1] = fVar39 - (fVar43 + fVar52);
              pfVar1[2] = fVar40 - (fVar44 + fVar54);
              pfVar1[3] = fVar41 - (fVar45 + fVar56);
              fVar78 = fVar38 - (fVar50 * 0.309017 - fVar42 * 0.809017);
              fVar79 = fVar39 - (fVar52 * 0.309017 - fVar43 * 0.809017);
              fVar80 = fVar40 - (fVar54 * 0.309017 - fVar44 * 0.809017);
              fVar81 = fVar41 - (fVar56 * 0.309017 - fVar45 * 0.809017);
              fVar69 = (fVar82 * 0.309017 - fVar62 * 0.809017) + fVar65;
              fVar70 = (fVar83 * 0.309017 - fVar63 * 0.809017) + fVar68;
              fVar75 = (fVar84 * 0.309017 - fVar64 * 0.809017) + fVar71;
              fVar77 = (fVar85 * 0.309017 - fVar66 * 0.809017) + fVar67;
              fVar65 = (fVar62 * 0.309017 - fVar82 * 0.809017) + fVar65;
              fVar68 = (fVar63 * 0.309017 - fVar83 * 0.809017) + fVar68;
              fVar71 = (fVar64 * 0.309017 - fVar84 * 0.809017) + fVar71;
              fVar67 = (fVar66 * 0.309017 - fVar85 * 0.809017) + fVar67;
              fVar38 = fVar38 - (fVar42 * 0.309017 - fVar50 * 0.809017);
              fVar39 = fVar39 - (fVar43 * 0.309017 - fVar52 * 0.809017);
              fVar40 = fVar40 - (fVar44 * 0.309017 - fVar54 * 0.809017);
              fVar41 = fVar41 - (fVar45 * 0.309017 - fVar56 * 0.809017);
              fVar50 = fVar72 * 0.58778524 + fVar58 * 0.95105654;
              fVar52 = fVar73 * 0.58778524 + fVar59 * 0.95105654;
              fVar54 = fVar74 * 0.58778524 + fVar60 * 0.95105654;
              fVar56 = fVar76 * 0.58778524 + fVar61 * 0.95105654;
              fVar62 = fVar51 * 0.58778524 + fVar46 * 0.95105654;
              fVar63 = fVar53 * 0.58778524 + fVar47 * 0.95105654;
              fVar64 = fVar55 * 0.58778524 + fVar48 * 0.95105654;
              fVar66 = fVar57 * 0.58778524 + fVar49 * 0.95105654;
              fVar58 = fVar58 * 0.58778524 - fVar72 * 0.95105654;
              fVar59 = fVar59 * 0.58778524 - fVar73 * 0.95105654;
              fVar60 = fVar60 * 0.58778524 - fVar74 * 0.95105654;
              fVar61 = fVar61 * 0.58778524 - fVar76 * 0.95105654;
              fVar42 = fVar46 * 0.58778524 - fVar51 * 0.95105654;
              fVar43 = fVar47 * 0.58778524 - fVar53 * 0.95105654;
              fVar44 = fVar48 * 0.58778524 - fVar55 * 0.95105654;
              fVar45 = fVar49 * 0.58778524 - fVar57 * 0.95105654;
              pfVar1 = pafVar21[-1] + lVar26;
              *pfVar1 = fVar69 - fVar50;
              pfVar1[1] = fVar70 - fVar52;
              pfVar1[2] = fVar75 - fVar54;
              pfVar1[3] = fVar77 - fVar56;
              lVar35 = (long)iVar34;
              pafVar3 = local_120 + (long)(int)uVar13 + lVar29 + lVar35 + -1;
              (*pafVar3)[0] = fVar50 + fVar69;
              (*pafVar3)[1] = fVar52 + fVar70;
              (*pafVar3)[2] = fVar54 + fVar75;
              (*pafVar3)[3] = fVar56 + fVar77;
              pfVar1 = *pafVar21 + lVar26;
              *pfVar1 = fVar62 + fVar78;
              pfVar1[1] = fVar63 + fVar79;
              pfVar1[2] = fVar64 + fVar80;
              pfVar1[3] = fVar66 + fVar81;
              pafVar3 = local_120 + (long)(int)uVar13 + lVar29 + lVar35;
              (*pafVar3)[0] = fVar62 - fVar78;
              (*pafVar3)[1] = fVar63 - fVar79;
              (*pafVar3)[2] = fVar64 - fVar80;
              (*pafVar3)[3] = fVar66 - fVar81;
              pfVar1 = pafVar9[-1] + lVar26;
              *pfVar1 = fVar65 - fVar58;
              pfVar1[1] = fVar68 - fVar59;
              pfVar1[2] = fVar71 - fVar60;
              pfVar1[3] = fVar67 - fVar61;
              pafVar3 = local_120 + (long)(int)uVar13 + lVar27 + lVar35 + -1;
              (*pafVar3)[0] = fVar58 + fVar65;
              (*pafVar3)[1] = fVar59 + fVar68;
              (*pafVar3)[2] = fVar60 + fVar71;
              (*pafVar3)[3] = fVar61 + fVar67;
              pfVar1 = *pafVar9 + lVar26;
              *pfVar1 = fVar42 + fVar38;
              pfVar1[1] = fVar43 + fVar39;
              pfVar1[2] = fVar44 + fVar40;
              pfVar1[3] = fVar45 + fVar41;
              pafVar3 = local_120 + (long)(int)uVar13 + lVar27 + lVar35;
              (*pafVar3)[0] = fVar42 - fVar38;
              (*pafVar3)[1] = fVar43 - fVar39;
              (*pafVar3)[2] = fVar44 - fVar40;
              (*pafVar3)[3] = fVar45 - fVar41;
              lVar26 = lVar26 + 8;
              iVar34 = iVar34 + -2;
            }
            pafVar9 = pafVar9 + lVar16 * 5;
            pafVar21 = pafVar21 + lVar16 * 5;
            pafVar31 = pafVar31 + lVar16 * 5;
            pafVar23 = pafVar23 + lVar16;
            pafVar15 = pafVar15 + lVar16;
            pafVar30 = pafVar30 + lVar16;
            pafVar14 = pafVar14 + lVar16;
            pafVar10 = pafVar10 + lVar16;
          }
        }
      }
      bVar37 = local_120 == work2;
      input_readonly = work1;
      local_120 = work2;
      if (bVar37) {
        input_readonly = work2;
        local_120 = work1;
      }
      uVar19 = uVar19 + 1;
      iVar34 = iVar17;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x3e2,
                  "v4sf *rfftf1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)");
  }
  __assert_fail("in != out && work1 != work2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x3c7,
                "v4sf *rfftf1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)");
}

Assistant:

static NEVER_INLINE(v4sf *) rfftf1_ps(int n, const v4sf *input_readonly, v4sf *work1, v4sf *work2, 
                                      const float *wa, const int *ifac) {  
  v4sf *in  = (v4sf*)input_readonly;
  v4sf *out = (in == work2 ? work1 : work2);
  int nf = ifac[1], k1;
  int l2 = n;
  int iw = n-1;
  assert(in != out && work1 != work2);
  for (k1 = 1; k1 <= nf; ++k1) {
    int kh = nf - k1;
    int ip = ifac[kh + 2];
    int l1 = l2 / ip;
    int ido = n / l2;
    iw -= (ip - 1)*ido;
    switch (ip) {
      case 5: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        int ix4 = ix3 + ido;
        radf5_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3], &wa[ix4]);
      } break;
      case 4: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        radf4_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3]);
      } break;
      case 3: {
        int ix2 = iw + ido;
        radf3_ps(ido, l1, in, out, &wa[iw], &wa[ix2]);
      } break;
      case 2:
        radf2_ps(ido, l1, in, out, &wa[iw]);
        break;
      default:
        assert(0);
        break;
    }
    l2 = l1;
    if (out == work2) {
      out = work1; in = work2;
    } else {
      out = work2; in = work1;
    }
  }
  return in; /* this is in fact the output .. */
}